

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::AtomicCounterCase::getNumAtomicCounterBuffers
          (AtomicCounterCase *this)

{
  Shader *pSVar1;
  int iVar2;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar3;
  int ndx;
  long lVar4;
  long lVar5;
  set<int,_std::less<int>,_std::allocator<int>_> buffers;
  
  buffers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &buffers._M_t._M_impl.super__Rb_tree_header._M_header;
  buffers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  buffers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  buffers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar5 = 0;
  lVar4 = 0;
  buffers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       buffers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    pvVar3 = ProgramInterfaceDefinition::Program::getShaders(this->m_program);
    pSVar1 = *(pvVar3->
              super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)*(pointer *)
                      ((long)&(pSVar1->m_defaultBlock).variables.
                              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                      + 8) -
              *(long *)&(pSVar1->m_defaultBlock).variables.
                        super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                        ._M_impl) / 0x60) <= lVar4) break;
    pvVar3 = ProgramInterfaceDefinition::Program::getShaders(this->m_program);
    if (*(int *)(*(long *)&((*(pvVar3->
                              super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                              )._M_impl.super__Vector_impl_data._M_start)->m_defaultBlock).variables
                           .
                           super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                           ._M_impl + 0x20 + lVar5) == 0) {
      pvVar3 = ProgramInterfaceDefinition::Program::getShaders(this->m_program);
      if (*(int *)(*(long *)&((*(pvVar3->
                                super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                )._M_impl.super__Vector_impl_data._M_start)->m_defaultBlock).
                             variables.
                             super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                             ._M_impl + 0x28 + lVar5) == 0x54) {
        pvVar3 = ProgramInterfaceDefinition::Program::getShaders(this->m_program);
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &buffers,(int *)(*(long *)&((*(pvVar3->
                                                 super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                              m_defaultBlock).variables.
                                              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                              ._M_impl + lVar5 + 4));
      }
    }
    lVar4 = lVar4 + 1;
    lVar5 = lVar5 + 0x60;
  }
  iVar2 = (int)buffers._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&buffers._M_t);
  return iVar2;
}

Assistant:

int AtomicCounterCase::getNumAtomicCounterBuffers (void) const
{
	std::set<int> buffers;

	for (int ndx = 0; ndx < (int)m_program->getShaders()[0]->getDefaultBlock().variables.size(); ++ndx)
	{
		if (m_program->getShaders()[0]->getDefaultBlock().variables[ndx].varType.isBasicType() &&
			glu::isDataTypeAtomicCounter(m_program->getShaders()[0]->getDefaultBlock().variables[ndx].varType.getBasicType()))
		{
			buffers.insert(m_program->getShaders()[0]->getDefaultBlock().variables[ndx].layout.binding);
		}
	}

	return (int)buffers.size();
}